

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverVI.cpp
# Opt level: O2

void __thiscall chrono::ChIterativeSolverVI::ArchiveIN(ChIterativeSolverVI *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChIterativeSolverVI *)&this[-1].dlambda_history,in_RSI);
  return;
}

Assistant:

void ChIterativeSolverVI::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChIterativeSolverVI>();
    // deserialize parent class
    ChSolver::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(m_max_iterations);
    marchive >> CHNVP(m_warm_start);
    marchive >> CHNVP(m_tolerance);
    marchive >> CHNVP(m_omega);
    marchive >> CHNVP(m_shlambda);
}